

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

ostream * argparse::operator<<(ostream *stream,ArgumentParser *parser)

{
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *plVar1;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *plVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  _List_node_base *p_Var6;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range3;
  sentry sen;
  sentry local_40 [16];
  
  std::ostream::sentry::sentry(local_40,stream);
  if (local_40[0] == (sentry)0x1) {
    *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) =
         *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) | 0x20;
    poVar4 = std::operator<<(stream,"Usage: ");
    poVar4 = std::operator<<(poVar4,(string *)parser);
    std::operator<<(poVar4," [options] ");
    sVar5 = ArgumentParser::get_length_of_longest_argument(parser);
    plVar1 = &parser->mPositionalArguments;
    p_Var6 = (_List_node_base *)plVar1;
    while (p_Var6 = (((_List_base<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                     &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar1) {
      poVar4 = std::operator<<(stream,(string *)p_Var6[1]._M_next);
      std::operator<<(poVar4," ");
    }
    std::operator<<(stream,"\n\n");
    p_Var6 = (_List_node_base *)plVar1;
    if ((plVar1->super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>)._M_impl.
        _M_node.super__List_node_base._M_next != (_List_node_base *)plVar1) {
      std::operator<<(stream,"Positional arguments:\n");
    }
    while (p_Var6 = (((_List_base<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                     &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar1) {
      *(size_t *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = sVar5;
      operator<<(stream,(Argument *)(p_Var6 + 1));
    }
    plVar2 = &parser->mOptionalArguments;
    p_Var6 = (_List_node_base *)plVar2;
    if ((parser->mOptionalArguments).
        super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)plVar2) {
      pcVar3 = "\n\n";
      if ((plVar1->super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>).
          _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)plVar1) {
        pcVar3 = "\a";
      }
      poVar4 = std::operator<<(stream,pcVar3 + 1);
      std::operator<<(poVar4,"Optional arguments:\n");
    }
    while (p_Var6 = (((_List_base<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                     &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar2) {
      *(size_t *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = sVar5;
      operator<<(stream,(Argument *)(p_Var6 + 1));
    }
  }
  std::ostream::sentry::~sentry(local_40);
  return stream;
}

Assistant:

auto operator<<(std::ostream &stream, const ArgumentParser &parser)
      -> std::ostream & {
    if (auto sen = std::ostream::sentry(stream)) {
      stream.setf(std::ios_base::left);
      stream << "Usage: " << parser.mProgramName << " [options] ";
      size_t tLongestArgumentLength = parser.get_length_of_longest_argument();

      for (const auto &argument : parser.mPositionalArguments) {
        stream << argument.mNames.front() << " ";
      }
      stream << "\n\n";

      if (!parser.mPositionalArguments.empty())
        stream << "Positional arguments:\n";

      for (const auto &mPositionalArgument : parser.mPositionalArguments) {
        stream.width(tLongestArgumentLength);
        stream << mPositionalArgument;
      }

      if (!parser.mOptionalArguments.empty())
        stream << (parser.mPositionalArguments.empty() ? "" : "\n")
               << "Optional arguments:\n";

      for (const auto &mOptionalArgument : parser.mOptionalArguments) {
        stream.width(tLongestArgumentLength);
        stream << mOptionalArgument;
      }
    }

    return stream;
  }